

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Sit(Map *this,Character *from,SitState sit_type)

{
  Character *other;
  PacketFamily family;
  bool bVar1;
  int num;
  undefined7 in_register_00000011;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  
  from->sitting = sit_type;
  Character::CancelSpell(from);
  family = PACKET_SIT;
  if ((int)CONCAT71(in_register_00000011,sit_type) == 1) {
    family = PACKET_CHAIR;
  }
  PacketBuilder::PacketBuilder(&builder,family,PACKET_PLAYER,6);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&builder,num);
  PacketBuilder::AddChar(&builder,(uint)from->x);
  PacketBuilder::AddChar(&builder,(uint)from->y);
  PacketBuilder::AddChar(&builder,(uint)from->direction);
  PacketBuilder::AddChar(&builder,0);
  p_Var2 = (_List_node_base *)&this->characters;
  while (p_Var2 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->characters) {
    other = (Character *)p_Var2[1]._M_next;
    if (other != from) {
      bVar1 = Character::InRange(from,other);
      if (bVar1) {
        Character::Send(other,&builder);
      }
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Map::Sit(Character *from, SitState sit_type)
{
	from->sitting = sit_type;

	from->CancelSpell();

	PacketBuilder builder((sit_type == SIT_CHAIR) ? PACKET_CHAIR : PACKET_SIT, PACKET_PLAYER, 6);
	builder.AddShort(from->PlayerID());
	builder.AddChar(from->x);
	builder.AddChar(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(0); // ?

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}